

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlCheckUTF8(uchar *utf)

{
  byte bVar1;
  int local_1c;
  uchar c;
  byte *pbStack_18;
  int ix;
  uchar *utf_local;
  
  pbStack_18 = utf;
  if (utf == (uchar *)0x0) {
    utf_local._4_4_ = 0;
  }
  else {
    for (; bVar1 = *pbStack_18, bVar1 != 0; pbStack_18 = pbStack_18 + local_1c) {
      if ((bVar1 & 0x80) == 0) {
        local_1c = 1;
      }
      else if ((bVar1 & 0xe0) == 0xc0) {
        if ((pbStack_18[1] & 0xc0) != 0x80) {
          return 0;
        }
        local_1c = 2;
      }
      else if ((bVar1 & 0xf0) == 0xe0) {
        if (((pbStack_18[1] & 0xc0) != 0x80) || ((pbStack_18[2] & 0xc0) != 0x80)) {
          return 0;
        }
        local_1c = 3;
      }
      else {
        if ((bVar1 & 0xf8) != 0xf0) {
          return 0;
        }
        if ((((pbStack_18[1] & 0xc0) != 0x80) || ((pbStack_18[2] & 0xc0) != 0x80)) ||
           ((pbStack_18[3] & 0xc0) != 0x80)) {
          return 0;
        }
        local_1c = 4;
      }
    }
    utf_local._4_4_ = 1;
  }
  return utf_local._4_4_;
}

Assistant:

int
xmlCheckUTF8(const unsigned char *utf)
{
    int ix;
    unsigned char c;

    if (utf == NULL)
        return(0);
    /*
     * utf is a string of 1, 2, 3 or 4 bytes.  The valid strings
     * are as follows (in "bit format"):
     *    0xxxxxxx                                      valid 1-byte
     *    110xxxxx 10xxxxxx                             valid 2-byte
     *    1110xxxx 10xxxxxx 10xxxxxx                    valid 3-byte
     *    11110xxx 10xxxxxx 10xxxxxx 10xxxxxx           valid 4-byte
     */
    while ((c = utf[0])) {      /* string is 0-terminated */
        ix = 0;
        if ((c & 0x80) == 0x00) {	/* 1-byte code, starts with 10 */
            ix = 1;
	} else if ((c & 0xe0) == 0xc0) {/* 2-byte code, starts with 110 */
	    if ((utf[1] & 0xc0 ) != 0x80)
	        return 0;
	    ix = 2;
	} else if ((c & 0xf0) == 0xe0) {/* 3-byte code, starts with 1110 */
	    if (((utf[1] & 0xc0) != 0x80) ||
	        ((utf[2] & 0xc0) != 0x80))
		    return 0;
	    ix = 3;
	} else if ((c & 0xf8) == 0xf0) {/* 4-byte code, starts with 11110 */
	    if (((utf[1] & 0xc0) != 0x80) ||
	        ((utf[2] & 0xc0) != 0x80) ||
		((utf[3] & 0xc0) != 0x80))
		    return 0;
	    ix = 4;
	} else				/* unknown encoding */
	    return 0;
        utf += ix;
      }
      return(1);
}